

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall jsonnet::internal::PrettyFieldNames::visit(PrettyFieldNames *this,Object *expr)

{
  bool bVar1;
  iterator this_00;
  reference name;
  Fodder *b;
  Identifier *pIVar2;
  UString *in_RSI;
  PrettyFieldNames *in_RDI;
  LiteralString *lit;
  LiteralString *field_expr;
  ObjectField *field;
  iterator __end2;
  iterator __begin2;
  ObjectFields *__range2;
  Object *in_stack_ffffffffffffff98;
  AST *in_stack_ffffffffffffffa0;
  AST *a;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_20;
  UString *local_18;
  
  local_18 = in_RSI + 4;
  local_20._M_current =
       (ObjectField *)
       std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
       ::begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                *)in_stack_ffffffffffffff98);
  this_00 = std::
            vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                   *)in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    name = __gnu_cxx::
           __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
           ::operator*(&local_20);
    if (name->kind == FIELD_EXPR) {
      a = name->expr1;
      if (a == (AST *)0x0) {
        b = (Fodder *)0x0;
      }
      else {
        b = (Fodder *)__dynamic_cast(a,&AST::typeinfo,&LiteralString::typeinfo,0);
      }
      if (b != (Fodder *)0x0) {
        name->kind = FIELD_STR;
        fodder_move_front((Fodder *)a,b);
        if ((name->methodSugar & 1U) == 0) {
          fodder_move_front((Fodder *)a,b);
        }
        else {
          fodder_move_front((Fodder *)a,b);
        }
      }
    }
    if (name->kind == FIELD_STR) {
      in_stack_ffffffffffffffa0 = name->expr1;
      if (in_stack_ffffffffffffffa0 == (AST *)0x0) {
        in_stack_ffffffffffffff98 = (Object *)0x0;
      }
      else {
        in_stack_ffffffffffffff98 =
             (Object *)
             __dynamic_cast(in_stack_ffffffffffffffa0,&AST::typeinfo,&LiteralString::typeinfo,0);
      }
      if ((in_stack_ffffffffffffff98 != (Object *)0x0) &&
         (bVar1 = isIdentifier(in_RDI,in_RSI), bVar1)) {
        name->kind = FIELD_ID;
        pIVar2 = Allocator::makeIdentifier((Allocator *)this_00._M_current,(UString *)name);
        name->id = pIVar2;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)__end2._M_current,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)field);
        name->expr1 = (AST *)0x0;
      }
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_20);
  }
  CompilerPass::visit((CompilerPass *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void visit(Object *expr)
    {
        for (auto &field : expr->fields) {
            // First try ["foo"] -> "foo".
            if (field.kind == ObjectField::FIELD_EXPR) {
                if (auto *field_expr = dynamic_cast<LiteralString *>(field.expr1)) {
                    field.kind = ObjectField::FIELD_STR;
                    fodder_move_front(field_expr->openFodder, field.fodder1);
                    if (field.methodSugar) {
                        fodder_move_front(field.fodderL, field.fodder2);
                    } else {
                        fodder_move_front(field.opFodder, field.fodder2);
                    }
                }
            }
            // Then try "foo" -> foo.
            if (field.kind == ObjectField::FIELD_STR) {
                if (auto *lit = dynamic_cast<LiteralString *>(field.expr1)) {
                    if (isIdentifier(lit->value)) {
                        field.kind = ObjectField::FIELD_ID;
                        field.id = alloc.makeIdentifier(lit->value);
                        field.fodder1 = lit->openFodder;
                        field.expr1 = nullptr;
                    }
                }
            }
        }
        FmtPass::visit(expr);
    }